

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperOneofFieldGenerator::GenerateSerializationCode
          (WrapperOneofFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  WrapperOneofFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_WrapperFieldGenerator).super_FieldGeneratorBase.
                              variables_,
                     "if ($has_property_check$) {\n  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n}\n"
                    );
  return;
}

Assistant:

void WrapperOneofFieldGenerator::GenerateSerializationCode(io::Printer* printer) {
  // TODO: I suspect this is wrong...
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n"
    "  _oneof_$name$_codec.WriteTagAndValue(output, ($type_name$) $oneof_name$_);\n"
    "}\n");
}